

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_sxx_syy.cpp
# Opt level: O3

AggregateFunction * duckdb::RegrSYYFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType local_50 [24];
  LogicalType local_38 [24];
  
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffe0,DOUBLE);
  duckdb::LogicalType::LogicalType(local_38,DOUBLE);
  duckdb::LogicalType::LogicalType(local_50,DOUBLE);
  AggregateFunction::
  BinaryAggregate<duckdb::RegrSState,double,double,double,duckdb::RegrSYYOperation,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffe0,local_38,local_50,in_R8);
  duckdb::LogicalType::~LogicalType(local_50);
  duckdb::LogicalType::~LogicalType(local_38);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffe0);
  return in_RDI;
}

Assistant:

AggregateFunction RegrSYYFun::GetFunction() {
	return AggregateFunction::BinaryAggregate<RegrSState, double, double, double, RegrSYYOperation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE);
}